

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O0

void * xmlMemRealloc(void *ptr,size_t size)

{
  long lVar1;
  int *__ptr;
  undefined4 *puVar2;
  size_t oldSize;
  MEMHDR *tmp;
  MEMHDR *p;
  size_t size_local;
  void *ptr_local;
  
  if (ptr == (void *)0x0) {
    ptr_local = xmlMemMalloc(size);
  }
  else {
    xmlInitParser();
    if (size < 0xfffffffffffffff0) {
      __ptr = (int *)((long)ptr + -0x10);
      if (*__ptr == 0x5aa5) {
        lVar1 = *(long *)((long)ptr + -8);
        *__ptr = -0x5aa6;
        puVar2 = (undefined4 *)realloc(__ptr,size + 0x10);
        if (puVar2 == (undefined4 *)0x0) {
          *__ptr = 0x5aa5;
          ptr_local = (void *)0x0;
        }
        else {
          *puVar2 = 0x5aa5;
          *(size_t *)(puVar2 + 2) = size;
          xmlMutexLock(&xmlMemMutex);
          debugMemSize = size + (debugMemSize - lVar1);
          xmlMutexUnlock(&xmlMemMutex);
          ptr_local = puVar2 + 4;
        }
      }
      else {
        xmlPrintErrorMessage("xmlMemRealloc: Tag error\n");
        ptr_local = (void *)0x0;
      }
    }
    else {
      ptr_local = (void *)0x0;
    }
  }
  return ptr_local;
}

Assistant:

void *
xmlMemRealloc(void *ptr, size_t size) {
    MEMHDR *p, *tmp;
    size_t oldSize;

    if (ptr == NULL)
        return(xmlMemMalloc(size));

    xmlInitParser();

    if (size > (MAX_SIZE_T - RESERVE_SIZE))
        return(NULL);

    p = CLIENT_2_HDR(ptr);
    if (p->mh_tag != MEMTAG) {
        xmlPrintErrorMessage("xmlMemRealloc: Tag error\n");
        return(NULL);
    }
    oldSize = p->mh_size;
    p->mh_tag = ~MEMTAG;

    tmp = (MEMHDR *) realloc(p, RESERVE_SIZE + size);
    if (!tmp) {
        p->mh_tag = MEMTAG;
        return(NULL);
    }
    p = tmp;
    p->mh_tag = MEMTAG;
    p->mh_size = size;

    xmlMutexLock(&xmlMemMutex);
    debugMemSize -= oldSize;
    debugMemSize += size;
    xmlMutexUnlock(&xmlMemMutex);

    return(HDR_2_CLIENT(p));
}